

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O2

void __thiscall FIX::FieldMap::removeGroup(FieldMap *this,int tag)

{
  _Base_ptr p_Var1;
  iterator __position;
  _Base_ptr p_Var2;
  int local_3c;
  _Vector_base<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_> local_38;
  
  local_3c = tag;
  __position = std::
               _Rb_tree<int,_std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
               ::find(&(this->m_groups)._M_t,&local_3c);
  if ((_Rb_tree_header *)__position._M_node != &(this->m_groups)._M_t._M_impl.super__Rb_tree_header)
  {
    p_Var2 = __position._M_node[1]._M_parent;
    p_Var1 = __position._M_node[1]._M_left;
    local_38._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__position._M_node[1]._M_right;
    __position._M_node[1]._M_parent = (_Base_ptr)0x0;
    __position._M_node[1]._M_left = (_Base_ptr)0x0;
    __position._M_node[1]._M_right = (_Base_ptr)0x0;
    local_38._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var2;
    local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var1;
    std::
    _Rb_tree<int,std::pair<int_const,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>>,std::_Select1st<std::pair<int_const,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>>>>
    ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>>,std::_Select1st<std::pair<int_const,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>>>>
                        *)&this->m_groups,__position);
    for (; p_Var2 != p_Var1; p_Var2 = (_Base_ptr)&p_Var2->_M_parent) {
      if (*(long **)p_Var2 != (long *)0x0) {
        (**(code **)(**(long **)p_Var2 + 8))();
      }
    }
    removeField(this,local_3c);
    std::_Vector_base<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>::~_Vector_base(&local_38);
  }
  return;
}

Assistant:

void FieldMap::removeGroup(int tag) {
  Groups::iterator tagWithGroups = m_groups.find(tag);
  if (tagWithGroups == m_groups.end()) {
    return;
  }

  std::vector<FieldMap *> toDelete;
  toDelete.swap(tagWithGroups->second);

  m_groups.erase(tagWithGroups);

  std::for_each(toDelete.begin(), toDelete.end(), [](FieldMap *group) { delete group; });

  removeField(tag);
}